

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::ComputeWeightedCost(cmCTestRunTest *this)

{
  float fVar1;
  double dVar2;
  rep_conflict rVar3;
  double current;
  double avgcost;
  double prev;
  cmCTestRunTest *this_local;
  
  dVar2 = (double)this->TestProperties->PreviousRuns;
  fVar1 = this->TestProperties->Cost;
  rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    (&(this->TestResult).ExecutionTime);
  if ((this->TestResult).Status == 9) {
    this->TestProperties->Cost = (float)((dVar2 * (double)fVar1 + rVar3) / (dVar2 + 1.0));
    this->TestProperties->PreviousRuns = this->TestProperties->PreviousRuns + 1;
  }
  return;
}

Assistant:

void cmCTestRunTest::ComputeWeightedCost()
{
  double prev = static_cast<double>(this->TestProperties->PreviousRuns);
  double avgcost = static_cast<double>(this->TestProperties->Cost);
  double current = this->TestResult.ExecutionTime.count();

  if (this->TestResult.Status == cmCTestTestHandler::COMPLETED) {
    this->TestProperties->Cost =
      static_cast<float>(((prev * avgcost) + current) / (prev + 1.0));
    this->TestProperties->PreviousRuns++;
  }
}